

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_open_debugfile_by_debuglink
              (backtrace_state *state,char *filename,char *debuglink_name,uint32_t debuglink_crc,
              backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *__dest;
  size_t __n;
  int *piVar7;
  char *__n_00;
  byte *pbVar8;
  uint uVar9;
  uint32_t uVar10;
  char *pcVar11;
  undefined1 local_118 [8];
  stat st;
  char *local_48;
  char *local_40;
  
  iVar1 = lstat(filename,(stat *)local_118);
  if ((iVar1 < 0) || (((uint)st.st_nlink & 0xf000) != 0xa000)) {
    local_48 = (char *)0x0;
    local_40 = (char *)0x0;
  }
  else {
    local_40 = (char *)0x0;
    local_48 = (char *)0x0;
    while (pcVar4 = (char *)tcmalloc_backtrace_alloc(state,0x80,error_callback,data),
          pcVar4 != (char *)0x0) {
      pcVar11 = (char *)0x80;
      while( true ) {
        pcVar5 = (char *)readlink(filename,pcVar4,(size_t)pcVar11);
        if ((long)pcVar5 < 0) {
          tcmalloc_backtrace_free(state,pcVar4,(size_t)pcVar11,error_callback,data);
          goto LAB_001279ac;
        }
        if (pcVar5 < pcVar11 + -1) break;
        tcmalloc_backtrace_free(state,pcVar4,(size_t)pcVar11,error_callback,data);
        pcVar11 = (char *)((long)pcVar11 * 2);
        pcVar4 = (char *)tcmalloc_backtrace_alloc(state,(size_t)pcVar11,error_callback,data);
        if (pcVar4 == (char *)0x0) goto LAB_001279ac;
      }
      pcVar4[(long)pcVar5] = '\0';
      if ((*pcVar4 != '/') && (pcVar5 = strrchr(filename,0x2f), pcVar5 != (char *)0x0)) {
        sVar6 = strlen(pcVar4);
        __dest = (char *)tcmalloc_backtrace_alloc
                                   (state,(size_t)(pcVar5 + (sVar6 - (long)filename) + 2),
                                    error_callback,data);
        if (__dest == (char *)0x0) {
          iVar1 = -1;
          goto LAB_00127a75;
        }
        __n_00 = pcVar5 + (1 - (long)filename);
        memcpy(__dest,filename,(size_t)__n_00);
        __n = strlen(pcVar4);
        memcpy(__dest + (long)__n_00,pcVar4,__n);
        (__dest + (long)__n_00)[__n] = '\0';
        tcmalloc_backtrace_free(state,pcVar4,(size_t)pcVar11,error_callback,data);
        pcVar4 = __dest;
        pcVar11 = pcVar5 + (sVar6 - (long)filename) + 2;
      }
      if (local_48 != (char *)0x0) {
        tcmalloc_backtrace_free(state,local_48,(size_t)local_40,error_callback,data);
      }
      iVar1 = lstat(pcVar4,(stat *)local_118);
      filename = pcVar4;
      local_40 = pcVar11;
      local_48 = pcVar4;
      if ((iVar1 < 0) || (((uint)st.st_nlink & 0xf000) != 0xa000)) break;
    }
  }
LAB_001279ac:
  pcVar11 = strrchr(filename,0x2f);
  pcVar4 = pcVar11 + (1 - (long)filename);
  if (pcVar11 == (char *)0x0) {
    filename = "";
    pcVar4 = (char *)0x0;
  }
  iVar1 = elf_try_debugfile(state,filename,(size_t)pcVar4,"",0,debuglink_name,error_callback,data);
  if ((iVar1 < 0) &&
     (iVar1 = elf_try_debugfile(state,filename,(size_t)pcVar4,".debug/",7,debuglink_name,
                                error_callback,data), iVar1 < 0)) {
    iVar2 = elf_try_debugfile(state,"/usr/lib/debug/",0xf,filename,(size_t)pcVar4,debuglink_name,
                              error_callback,data);
    iVar1 = -1;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
  }
LAB_00127a75:
  if ((local_48 != (char *)0x0) && (local_40 != (char *)0x0)) {
    tcmalloc_backtrace_free(state,local_48,(size_t)local_40,error_callback,data);
  }
  iVar2 = -1;
  if ((-1 < iVar1) && (iVar2 = iVar1, debuglink_crc != 0)) {
    iVar3 = fstat(iVar1,(stat *)local_118);
    if (iVar3 < 0) {
      piVar7 = __errno_location();
      (*error_callback)(data,"fstat",*piVar7);
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      iVar3 = tcmalloc_backtrace_get_view
                        (state,iVar1,0,st.st_rdev,error_callback,data,
                         (backtrace_view *)(st.__glibc_reserved + 2));
      if (iVar3 != 0) {
        if ((long)st.st_rdev < 1) {
          uVar10 = 0;
        }
        else {
          pbVar8 = (byte *)(st.st_rdev + st.__glibc_reserved[2]);
          uVar9 = 0xffffffff;
          do {
            uVar9 = uVar9 >> 8 ^
                    *(uint *)(elf_crc32_crc32_table +
                             (ulong)(byte)(*(byte *)st.__glibc_reserved[2] ^ (byte)uVar9) * 4);
            st.__glibc_reserved[2] = st.__glibc_reserved[2] + 1;
          } while ((ulong)st.__glibc_reserved[2] < pbVar8);
          uVar10 = ~uVar9;
        }
        tcmalloc_backtrace_release_view
                  (state,(backtrace_view *)(st.__glibc_reserved + 2),error_callback,data);
      }
    }
    if (uVar10 != debuglink_crc) {
      tcmalloc_backtrace_close(iVar1,error_callback,data);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int
elf_open_debugfile_by_debuglink (struct backtrace_state *state,
				 const char *filename,
				 const char *debuglink_name,
				 uint32_t debuglink_crc,
				 backtrace_error_callback error_callback,
				 void *data)
{
  int ddescriptor;

  ddescriptor = elf_find_debugfile_by_debuglink (state, filename,
						 debuglink_name,
						 error_callback, data);
  if (ddescriptor < 0)
    return -1;

  if (debuglink_crc != 0)
    {
      uint32_t got_crc;

      got_crc = elf_crc32_file (state, ddescriptor, error_callback, data);
      if (got_crc != debuglink_crc)
	{
	  backtrace_close (ddescriptor, error_callback, data);
	  return -1;
	}
    }

  return ddescriptor;
}